

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::LSTM_x86_avx::create_pipeline(LSTM_x86_avx *this,Option *opt)

{
  long lVar1;
  long lVar2;
  int iVar3;
  _func_int **pp_Var4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint _c;
  uint uVar25;
  ulong uVar26;
  _func_int *p_Var27;
  uint _w;
  long lVar28;
  undefined4 *puVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  void *pvVar39;
  void *pvVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  undefined4 *puVar44;
  ulong uVar45;
  undefined8 *puVar46;
  long lVar47;
  long lVar48;
  long local_140;
  long local_100;
  long local_d0;
  long local_c8;
  
  p_Var27 = this->_vptr_LSTM_x86_avx[-3];
  _c = (*(int *)(p_Var27 + 0x40 + (long)&(this->weight_hc_data_packed).data) == 2) + 1;
  iVar3 = *(int *)(p_Var27 + 0x44 + (long)&(this->weight_hc_data_packed).data);
  iVar16 = (int)((long)((ulong)(uint)((int)((long)*(int *)(p_Var27 + 0x3c +
                                                          (long)&(this->weight_hc_data_packed).data)
                                           / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)*(int *)(p_Var27 + 0x3c + (long)&(this->weight_hc_data_packed).data) /
                       (long)(int)_c & 0xffffffffU) / (long)iVar3);
  iVar20 = iVar16 + 3;
  if (-1 < iVar16) {
    iVar20 = iVar16;
  }
  _w = iVar20 >> 2;
  uVar45 = 0;
  Mat::create(&this->weight_xc_data_packed,_w,iVar3 / 2 + iVar3 % 2,_c,0x20,8,(Allocator *)0x0);
  Mat::create(&this->bias_c_data_packed,
              *(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x44 +
                      (long)&(this->weight_hc_data_packed).data),1,_c,0x10,4,(Allocator *)0x0);
  iVar3 = *(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data);
  Mat::create(&this->weight_hc_data_packed,
              *(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                      (long)&(this->weight_hc_data_packed).data),iVar3 / 2 + iVar3 % 2,_c,0x20,8,
              (Allocator *)0x0);
  pp_Var4 = this->_vptr_LSTM_x86_avx;
  pvVar40 = (this->weight_xc_data_packed).data;
  sVar5 = (this->weight_xc_data_packed).elemsize;
  pvVar6 = (this->bias_c_data_packed).data;
  sVar7 = (this->bias_c_data_packed).cstep;
  sVar8 = (this->bias_c_data_packed).elemsize;
  pvVar9 = (this->weight_hc_data_packed).data;
  sVar10 = (this->weight_hc_data_packed).elemsize;
  lVar35 = (this->weight_hc_data_packed).cstep * sVar10;
  lVar28 = (long)(this->weight_hc_data_packed).w * sVar10;
  p_Var27 = pp_Var4[-3];
  lVar24 = (this->weight_xc_data_packed).cstep * sVar5;
  lVar21 = (long)(this->weight_xc_data_packed).w * sVar5;
  local_100 = (long)pvVar40 + 8;
  local_140 = (long)pvVar9 + 8;
  do {
    lVar22 = (long)*(int *)(&this->field_0x154 + (long)p_Var27);
    lVar11 = *(long *)(&this->field_0x128 + (long)p_Var27);
    lVar33 = *(long *)(&this->field_0x168 + (long)p_Var27);
    lVar12 = *(long *)(&this->field_0x138 + (long)p_Var27);
    lVar36 = *(long *)(&this->field_0x1b0 + (long)p_Var27) * uVar45 *
             *(long *)(&this->field_0x180 + (long)p_Var27) +
             *(long *)(&this->field_0x170 + (long)p_Var27);
    lVar37 = (long)*(int *)(&this->field_0x10c + (long)p_Var27);
    lVar13 = *(long *)(&this->field_0xe0 + (long)p_Var27);
    lVar34 = *(long *)(&this->field_0x120 + (long)p_Var27);
    lVar14 = *(long *)(&this->field_0xf0 + (long)p_Var27);
    puVar29 = (undefined4 *)(sVar7 * sVar8 * uVar45 + (long)pvVar6);
    lVar23 = (long)*(int *)(&this->field_0x19c + (long)p_Var27) *
             *(long *)(&this->field_0x180 + (long)p_Var27);
    lVar1 = lVar36 + lVar23;
    lVar2 = lVar36 + lVar23 * 2;
    lVar23 = lVar23 * 3 + lVar36;
    iVar3 = *(int *)(p_Var27 + 0x44 + (long)&(this->weight_hc_data_packed).data);
    if (iVar3 < 2) {
      uVar26 = 0;
    }
    else {
      lVar31 = lVar33 * uVar45;
      local_c8 = (lVar31 + lVar22) * lVar12 + lVar11;
      lVar30 = lVar12 * lVar22 * 2;
      local_d0 = lVar31 * lVar12 + lVar11;
      lVar47 = lVar34 * uVar45;
      lVar32 = (lVar47 + lVar37) * lVar14 + lVar13;
      lVar38 = lVar14 * lVar37 * 2;
      lVar48 = lVar47 * lVar14 + lVar13;
      iVar20 = 1;
      uVar26 = 0;
      pvVar39 = pvVar40;
      do {
        *puVar29 = *(undefined4 *)(lVar36 + uVar26 * 4);
        puVar29[1] = *(undefined4 *)(lVar1 + uVar26 * 4);
        puVar29[2] = *(undefined4 *)(lVar2 + uVar26 * 4);
        puVar29[3] = *(undefined4 *)(lVar23 + uVar26 * 4);
        puVar29[4] = *(undefined4 *)(lVar36 + 4 + uVar26 * 4);
        puVar29[5] = *(undefined4 *)(lVar1 + 4 + uVar26 * 4);
        puVar29[6] = *(undefined4 *)(lVar2 + 4 + uVar26 * 4);
        puVar29[7] = *(undefined4 *)(lVar23 + 4 + uVar26 * 4);
        p_Var27 = pp_Var4[-3];
        iVar3 = *(int *)(p_Var27 + 0x44 + (long)&(this->weight_hc_data_packed).data);
        iVar19 = iVar3 * 2;
        iVar18 = iVar3 * 3;
        iVar17 = (int)uVar26;
        if (3 < iVar16) {
          lVar41 = 0;
          uVar43 = (ulong)_w;
          do {
            *(undefined4 *)((long)pvVar39 + lVar41 * 8) = *(undefined4 *)(local_d0 + lVar41);
            *(undefined4 *)((long)pvVar39 + lVar41 * 8 + 4) =
                 *(undefined4 *)(((iVar17 + iVar3) * lVar22 + lVar31) * lVar12 + lVar11 + lVar41);
            *(undefined4 *)((long)pvVar39 + lVar41 * 8 + 8) =
                 *(undefined4 *)(((iVar19 + iVar17) * lVar22 + lVar31) * lVar12 + lVar11 + lVar41);
            *(undefined4 *)((long)pvVar39 + lVar41 * 8 + 0xc) =
                 *(undefined4 *)(((iVar17 + iVar18) * lVar22 + lVar31) * lVar12 + lVar11 + lVar41);
            *(undefined4 *)((long)pvVar39 + lVar41 * 8 + 0x10) = *(undefined4 *)(local_c8 + lVar41);
            *(undefined4 *)((long)pvVar39 + lVar41 * 8 + 0x14) =
                 *(undefined4 *)(((iVar3 + iVar20) * lVar22 + lVar31) * lVar12 + lVar11 + lVar41);
            *(undefined4 *)((long)pvVar39 + lVar41 * 8 + 0x18) =
                 *(undefined4 *)(((iVar20 + iVar19) * lVar22 + lVar31) * lVar12 + lVar11 + lVar41);
            *(undefined4 *)((long)pvVar39 + lVar41 * 8 + 0x1c) =
                 *(undefined4 *)(((iVar20 + iVar18) * lVar22 + lVar31) * lVar12 + lVar11 + lVar41);
            lVar41 = lVar41 + 4;
            uVar43 = uVar43 - 1;
          } while (uVar43 != 0);
          p_Var27 = pp_Var4[-3];
        }
        if (0 < *(int *)(p_Var27 + 0x38 + (long)&(this->weight_hc_data_packed).data)) {
          puVar44 = (undefined4 *)((long)pvVar9 + (uVar26 >> 1) * lVar28 + lVar35 * uVar45);
          lVar41 = 0;
          do {
            *puVar44 = *(undefined4 *)(lVar48 + lVar41 * 4);
            puVar44[1] = *(undefined4 *)
                          (((iVar3 + iVar17) * lVar37 + lVar47) * lVar14 + lVar13 + lVar41 * 4);
            puVar44[2] = *(undefined4 *)
                          (((iVar19 + iVar17) * lVar37 + lVar47) * lVar14 + lVar13 + lVar41 * 4);
            puVar44[3] = *(undefined4 *)
                          (((iVar18 + iVar17) * lVar37 + lVar47) * lVar14 + lVar13 + lVar41 * 4);
            puVar44[4] = *(undefined4 *)(lVar32 + lVar41 * 4);
            puVar44[5] = *(undefined4 *)
                          (((iVar3 + iVar20) * lVar37 + lVar47) * lVar14 + lVar13 + lVar41 * 4);
            puVar44[6] = *(undefined4 *)
                          (((iVar20 + iVar19) * lVar37 + lVar47) * lVar14 + lVar13 + lVar41 * 4);
            puVar44[7] = *(undefined4 *)
                          (((iVar20 + iVar18) * lVar37 + lVar47) * lVar14 + lVar13 + lVar41 * 4);
            lVar41 = lVar41 + 1;
            p_Var27 = pp_Var4[-3];
            puVar44 = puVar44 + 8;
          } while (lVar41 < *(int *)(p_Var27 + 0x38 + (long)&(this->weight_hc_data_packed).data));
        }
        puVar29 = puVar29 + 8;
        uVar26 = uVar26 + 2;
        iVar3 = *(int *)(p_Var27 + 0x44 + (long)&(this->weight_hc_data_packed).data);
        iVar20 = iVar20 + 2;
        local_c8 = local_c8 + lVar30;
        local_d0 = local_d0 + lVar30;
        pvVar39 = (void *)((long)pvVar39 + lVar21);
        lVar32 = lVar32 + lVar38;
        lVar48 = lVar48 + lVar38;
      } while ((int)((uint)uVar26 | 1) < iVar3);
    }
    if ((int)uVar26 < iVar3) {
      uVar43 = uVar26 & 0xffffffff;
      lVar33 = lVar33 * uVar45;
      lVar30 = (lVar22 * uVar43 + lVar33) * lVar12 + lVar11;
      lVar34 = lVar34 * uVar45;
      lVar38 = (lVar37 * uVar43 + lVar34) * lVar14 + lVar13;
      do {
        uVar25 = (uint)uVar26;
        uVar26 = (ulong)((uVar25 & 1) + ((uint)(uVar26 >> 1) & 0x7fffffff));
        *puVar29 = *(undefined4 *)(lVar36 + uVar43 * 4);
        puVar29[1] = *(undefined4 *)(lVar1 + uVar43 * 4);
        puVar29[2] = *(undefined4 *)(lVar2 + uVar43 * 4);
        puVar29[3] = *(undefined4 *)(lVar23 + uVar43 * 4);
        p_Var27 = pp_Var4[-3];
        iVar3 = *(int *)(p_Var27 + 0x44 + (long)&(this->weight_hc_data_packed).data);
        if (3 < iVar16) {
          puVar44 = (undefined4 *)(lVar21 * uVar26 + local_100);
          uVar42 = 0;
          do {
            puVar44[-2] = *(undefined4 *)(lVar30 + uVar42 * 4);
            puVar44[-1] = *(undefined4 *)
                           (((int)(iVar3 + uVar25) * lVar22 + lVar33) * lVar12 + lVar11 + uVar42 * 4
                           );
            *puVar44 = *(undefined4 *)
                        (((int)(uVar25 + iVar3 * 2) * lVar22 + lVar33) * lVar12 + lVar11 +
                        uVar42 * 4);
            puVar44[1] = *(undefined4 *)
                          (((int)(uVar25 + iVar3 * 3) * lVar22 + lVar33) * lVar12 + lVar11 +
                          uVar42 * 4);
            uVar42 = uVar42 + 1;
            puVar44 = puVar44 + 4;
          } while (_w != uVar42);
          p_Var27 = pp_Var4[-3];
        }
        if (0 < *(int *)(p_Var27 + 0x38 + (long)&(this->weight_hc_data_packed).data)) {
          puVar44 = (undefined4 *)(uVar26 * lVar28 + local_140);
          lVar31 = 0;
          do {
            puVar44[-2] = *(undefined4 *)(lVar38 + lVar31 * 4);
            puVar44[-1] = *(undefined4 *)
                           (((int)(iVar3 + uVar25) * lVar37 + lVar34) * lVar14 + lVar13 + lVar31 * 4
                           );
            *puVar44 = *(undefined4 *)
                        (((int)(iVar3 * 2 + uVar25) * lVar37 + lVar34) * lVar14 + lVar13 +
                        lVar31 * 4);
            puVar44[1] = *(undefined4 *)
                          (((int)(iVar3 * 3 + uVar25) * lVar37 + lVar34) * lVar14 + lVar13 +
                          lVar31 * 4);
            lVar31 = lVar31 + 1;
            p_Var27 = pp_Var4[-3];
            puVar44 = puVar44 + 4;
          } while (lVar31 < *(int *)(p_Var27 + 0x38 + (long)&(this->weight_hc_data_packed).data));
        }
        puVar29 = puVar29 + 4;
        uVar43 = uVar43 + 1;
        uVar26 = (ulong)(uVar25 + 1);
        lVar30 = lVar30 + lVar12 * lVar22;
        lVar38 = lVar38 + lVar14 * lVar37;
      } while ((long)uVar43 <
               (long)*(int *)(p_Var27 + 0x44 + (long)&(this->weight_hc_data_packed).data));
    }
    uVar45 = uVar45 + 1;
    pvVar40 = (void *)((long)pvVar40 + lVar24);
    local_100 = local_100 + lVar24;
    local_140 = local_140 + lVar35;
  } while (uVar45 != _c);
  if (opt->lightmode != false) {
    puVar46 = (undefined8 *)(&this->field_0x128 + (long)p_Var27);
    piVar15 = (int *)puVar46[1];
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (*(long **)(&this->field_0x148 + (long)p_Var27) == (long *)0x0) {
          if (*(void **)(&this->field_0x128 + (long)p_Var27) != (void *)0x0) {
            free(*(void **)(&this->field_0x128 + (long)p_Var27));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x148 + (long)p_Var27) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x168 + (long)p_Var27) = 0;
    *(undefined8 *)((long)puVar46 + 0xc) = 0;
    *(undefined8 *)((long)puVar46 + 0x14) = 0;
    *puVar46 = 0;
    puVar46[1] = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var27) = 0;
    *(undefined4 *)(&this->field_0x160 + (long)p_Var27) = 0;
    p_Var27 = this->_vptr_LSTM_x86_avx[-3];
    piVar15 = *(int **)(&this->field_0x178 + (long)p_Var27);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (*(long **)(&this->field_0x190 + (long)p_Var27) == (long *)0x0) {
          if (*(void **)(&this->field_0x170 + (long)p_Var27) != (void *)0x0) {
            free(*(void **)(&this->field_0x170 + (long)p_Var27));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x190 + (long)p_Var27) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b0 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var27) = 0;
    *(undefined4 *)(&this->field_0x1a8 + (long)p_Var27) = 0;
    p_Var27 = this->_vptr_LSTM_x86_avx[-3];
    piVar15 = *(int **)(&this->field_0xe8 + (long)p_Var27);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (*(long **)(&this->field_0x100 + (long)p_Var27) == (long *)0x0) {
          if (*(void **)(&this->field_0xe0 + (long)p_Var27) != (void *)0x0) {
            free(*(void **)(&this->field_0xe0 + (long)p_Var27));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x100 + (long)p_Var27) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x120 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0xec + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0xe0 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0x108 + (long)p_Var27) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var27) = 0;
    *(undefined4 *)(&this->field_0x118 + (long)p_Var27) = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_avx::create_pipeline(const Option& opt)
{
    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}